

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

int32_t __thiscall
fasttext::Dictionary::getLine
          (Dictionary *this,istream *in,vector<int,_std::allocator<int>_> *words,
          vector<int,_std::allocator<int>_> *labels)

{
  char *pcVar1;
  pointer piVar2;
  iterator __position;
  bool bVar3;
  entry_type eVar4;
  int32_t iVar5;
  int iVar6;
  long lVar7;
  uint32_t h;
  undefined8 uVar8;
  int32_t iVar9;
  vector<int,_std::allocator<int>_> word_hashes;
  string token;
  uint32_t local_7c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  int *local_68;
  vector<int,_std::allocator<int>_> *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_58._M_allocated_capacity = (size_type)&local_48;
  local_68 = (int *)0x0;
  local_58._8_8_ = 0;
  local_78._M_allocated_capacity = 0;
  local_78._8_8_ = (int *)0x0;
  local_48._M_local_buf[0] = '\0';
  uVar8 = this;
  reset(this,in);
  piVar2 = (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar2;
  }
  piVar2 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  iVar9 = 0;
  local_60 = words;
  local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)labels;
  while (bVar3 = readWord((Dictionary *)uVar8,in,(string *)&local_58), bVar3) {
    if (local_58._8_8_ == 0) {
      h = 0x811c9dc5;
    }
    else {
      h = 0x811c9dc5;
      lVar7 = 0;
      do {
        pcVar1 = (char *)(local_58._M_allocated_capacity + lVar7);
        lVar7 = lVar7 + 1;
        h = ((int)*pcVar1 ^ h) * 0x1000193;
      } while (local_58._8_8_ != lVar7);
    }
    iVar5 = find(this,(string *)&local_58,h);
    iVar5 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar5];
    if (iVar5 < 0) {
      uVar8 = &local_58;
      lVar7 = std::__cxx11::string::find
                        (local_58._M_local_buf,
                         (ulong)(((this->args_).
                                  super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->label)._M_dataplus._M_p,0);
      eVar4 = lVar7 == 0;
    }
    else {
      uVar8 = this;
      eVar4 = getType(this,iVar5);
    }
    if (eVar4 == word) {
      uVar8 = this;
      addSubwords(this,local_60,(string *)&local_58,iVar5);
      local_7c = h;
      if ((int *)local_78._8_8_ == local_68) {
        uVar8 = &local_78;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)uVar8,(iterator)local_78._8_8_,
                   (int *)&local_7c);
      }
      else {
        *(uint32_t *)local_78._8_8_ = h;
        local_78._8_8_ = local_78._8_8_ + 4;
      }
    }
    else if ((-1 < iVar5) && (eVar4 == label)) {
      local_7c = iVar5 - this->nwords_;
      __position._M_current = *(int **)(local_38->_M_local_buf + 8);
      uVar8 = local_38;
      if (__position._M_current == (int *)local_38[1]._M_allocated_capacity) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_38,__position,(int *)&local_7c);
      }
      else {
        *__position._M_current = local_7c;
        *(int **)(local_38->_M_local_buf + 8) = __position._M_current + 1;
      }
    }
    iVar9 = iVar9 + 1;
    if ((local_58._8_8_ == DAT_00140f80) &&
       ((local_58._8_8_ == 0 ||
        (uVar8 = local_58._M_allocated_capacity,
        iVar6 = bcmp((void *)local_58._M_allocated_capacity,EOS_abi_cxx11_,local_58._8_8_),
        iVar6 == 0)))) break;
  }
  addWordNgrams(this,local_60,(vector<int,_std::allocator<int>_> *)&local_78,
                ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->wordNgrams);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity);
  }
  if ((void *)local_78._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_78._M_allocated_capacity);
  }
  return iVar9;
}

Assistant:

int32_t Dictionary::getLine(
    std::istream& in,
    std::vector<int32_t>& words,
    std::vector<int32_t>& labels) const {
  std::vector<int32_t> word_hashes;
  std::string token;
  int32_t ntokens = 0;

  reset(in);
  words.clear();
  labels.clear();
  while (readWord(in, token)) {
    uint32_t h = hash(token);
    int32_t wid = getId(token, h);
    entry_type type = wid < 0 ? getType(token) : getType(wid);

    ntokens++;
    if (type == entry_type::word) {
      addSubwords(words, token, wid);
      word_hashes.push_back(h);
    } else if (type == entry_type::label && wid >= 0) {
      labels.push_back(wid - nwords_);
    }
    if (token == EOS) {
      break;
    }
  }
  addWordNgrams(words, word_hashes, args_->wordNgrams);
  return ntokens;
}